

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-not-readable-nor-writable-on-read-error.c
# Opt level: O1

int run_test_not_readable_nor_writable_on_read_error(void)

{
  int iVar1;
  undefined8 *extraout_RDX;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in sa;
  undefined1 auStack_40 [16];
  code *pcStack_30;
  long local_28;
  long local_20;
  undefined1 local_18 [16];
  
  pcStack_30 = (code *)0x1ae843;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_18);
  local_20 = (long)iVar1;
  local_28 = 0;
  if (local_20 == 0) {
    pcStack_30 = (code *)0x1ae86d;
    iVar1 = uv_loop_init(&loop);
    local_20 = (long)iVar1;
    local_28 = 0;
    if (local_20 != 0) goto LAB_001aea13;
    pcStack_30 = (code *)0x1ae89e;
    iVar1 = uv_tcp_init(&loop,&tcp_client);
    local_20 = (long)iVar1;
    local_28 = 0;
    if (local_20 != 0) goto LAB_001aea20;
    pcStack_30 = (code *)0x1ae8db;
    iVar1 = uv_tcp_connect(&connect_req,&tcp_client,local_18,connect_cb);
    local_20 = (long)iVar1;
    local_28 = 0;
    if (local_20 != 0) goto LAB_001aea2d;
    pcStack_30 = (code *)0x1ae907;
    iVar1 = uv_run(&loop,0);
    local_20 = (long)iVar1;
    local_28 = 0;
    if (local_20 != 0) goto LAB_001aea3a;
    local_20 = 1;
    local_28 = (long)connect_cb_called;
    if (local_28 != 1) goto LAB_001aea47;
    local_20 = 1;
    local_28 = (long)read_cb_called;
    if (local_28 != 1) goto LAB_001aea54;
    local_20 = 1;
    local_28 = (long)write_cb_called;
    if (local_28 != 1) goto LAB_001aea61;
    local_20 = 1;
    local_28 = (long)close_cb_called;
    if (local_28 != 1) goto LAB_001aea6e;
    pcStack_30 = (code *)0x1ae9c9;
    uv_walk(&loop,close_walk_cb,0);
    pcStack_30 = (code *)0x1ae9d3;
    uv_run(&loop,0);
    local_20 = 0;
    pcStack_30 = (code *)0x1ae9e4;
    iVar1 = uv_loop_close(&loop);
    local_28 = (long)iVar1;
    if (local_20 == local_28) {
      pcStack_30 = (code *)0x1ae9fe;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_30 = (code *)0x1aea13;
    run_test_not_readable_nor_writable_on_read_error_cold_1();
LAB_001aea13:
    pcStack_30 = (code *)0x1aea20;
    run_test_not_readable_nor_writable_on_read_error_cold_2();
LAB_001aea20:
    pcStack_30 = (code *)0x1aea2d;
    run_test_not_readable_nor_writable_on_read_error_cold_3();
LAB_001aea2d:
    pcStack_30 = (code *)0x1aea3a;
    run_test_not_readable_nor_writable_on_read_error_cold_4();
LAB_001aea3a:
    pcStack_30 = (code *)0x1aea47;
    run_test_not_readable_nor_writable_on_read_error_cold_5();
LAB_001aea47:
    pcStack_30 = (code *)0x1aea54;
    run_test_not_readable_nor_writable_on_read_error_cold_6();
LAB_001aea54:
    pcStack_30 = (code *)0x1aea61;
    run_test_not_readable_nor_writable_on_read_error_cold_7();
LAB_001aea61:
    pcStack_30 = (code *)0x1aea6e;
    run_test_not_readable_nor_writable_on_read_error_cold_8();
LAB_001aea6e:
    pcStack_30 = (code *)0x1aea7b;
    run_test_not_readable_nor_writable_on_read_error_cold_9();
  }
  iVar1 = (int)&local_28;
  pcStack_30 = connect_cb;
  run_test_not_readable_nor_writable_on_read_error_cold_10();
  connect_cb_called = connect_cb_called + 1;
  auStack_40._0_8_ = SEXT48(iVar1);
  if (auStack_40._0_8_ == 0) {
    iVar1 = uv_read_start(&tcp_client,alloc_cb,read_cb);
    auStack_40._0_8_ = SEXT48(iVar1);
    if (auStack_40._0_8_ == 0) {
      auStack_40 = uv_buf_init(reset_me_cmd,3);
      iVar1 = uv_write(&write_req,&tcp_client,auStack_40,1,write_cb);
      pcStack_30 = (code *)0x0;
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001aeb67;
    }
  }
  else {
    connect_cb_cold_1();
  }
  connect_cb_cold_2();
LAB_001aeb67:
  connect_cb_cold_3();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x40;
  return 0x36e800;
}

Assistant:

TEST_IMPL(not_readable_nor_writable_on_read_error) {
  struct sockaddr_in sa;
  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &sa));
  ASSERT_OK(uv_loop_init(&loop));
  ASSERT_OK(uv_tcp_init(&loop, &tcp_client));

  ASSERT_OK(uv_tcp_connect(&connect_req,
                           &tcp_client,
                           (const struct sockaddr*) &sa,
                           connect_cb));

  ASSERT_OK(uv_run(&loop, UV_RUN_DEFAULT));

  ASSERT_EQ(1, connect_cb_called);
  ASSERT_EQ(1, read_cb_called);
  ASSERT_EQ(1, write_cb_called);
  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(&loop);
  return 0;
}